

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void * __thiscall tetgenmesh::arraypool::lookup(arraypool *this,int objectindex)

{
  int iVar1;
  int topindex;
  char *block;
  int objectindex_local;
  arraypool *this_local;
  
  if (this->toparray == (char **)0x0) {
    this_local = (arraypool *)0x0;
  }
  else {
    iVar1 = objectindex >> ((byte)this->log2objectsperblock & 0x1f);
    if (iVar1 < this->toparraylen) {
      if (this->toparray[iVar1] == (char *)0x0) {
        this_local = (arraypool *)0x0;
      }
      else {
        this_local = (arraypool *)
                     (this->toparray[iVar1] +
                     (int)((objectindex & this->objectsperblock - 1U) * this->objectbytes));
      }
    }
    else {
      this_local = (arraypool *)0x0;
    }
  }
  return this_local;
}

Assistant:

void* tetgenmesh::arraypool::lookup(int objectindex)
{
  char *block;
  int topindex;

  // Has the top array been allocated yet?
  if (toparray == (char **) NULL) {
    return (void *) NULL;
  }

  // Compute the index in the top array (upper bits).
  topindex = objectindex >> log2objectsperblock;
  // Does the top index fit in the top array?
  if (topindex >= toparraylen) {
    return (void *) NULL;
  }

  // Find the block, or learn that it hasn't been allocated yet.
  block = toparray[topindex];
  if (block == (char *) NULL) {
    return (void *) NULL;
  }

  // Compute a pointer to the object with the given index.  Note that
  //   'objectsperblock' is a power of two, so the & operation is a bit mask
  //   that preserves the lower bits.
  return (void *)(block + (objectindex & (objectsperblock - 1)) * objectbytes);
}